

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

void Abc_CollectTopOr_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vSuper)

{
  uint uVar1;
  int iVar2;
  void **ppvVar3;
  
  for (; (((ulong)pObj & 1) == 0 && ((*(uint *)&pObj->field_0x14 & 0xf) == 7));
      pObj = (Abc_Obj_t *)
             ((ulong)(*(uint *)&pObj->field_0x14 >> 0xb & 1) ^
             (ulong)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[1]])) {
    Abc_CollectTopOr_rec
              ((Abc_Obj_t *)
               ((ulong)(*(uint *)&pObj->field_0x14 >> 10 & 1) ^
               (ulong)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray]),vSuper);
  }
  uVar1 = vSuper->nSize;
  if (uVar1 == vSuper->nCap) {
    if ((int)uVar1 < 0x10) {
      if (vSuper->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(vSuper->pArray,0x80);
      }
      vSuper->pArray = ppvVar3;
      vSuper->nCap = 0x10;
    }
    else {
      if (vSuper->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(vSuper->pArray,(ulong)uVar1 << 4);
      }
      vSuper->pArray = ppvVar3;
      vSuper->nCap = uVar1 * 2;
    }
  }
  else {
    ppvVar3 = vSuper->pArray;
  }
  iVar2 = vSuper->nSize;
  vSuper->nSize = iVar2 + 1;
  ppvVar3[iVar2] = pObj;
  return;
}

Assistant:

void Abc_CollectTopOr_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vSuper )
{
    if ( Abc_ObjIsComplement(pObj) || !Abc_ObjIsNode(pObj) )
    {
        Vec_PtrPush( vSuper, pObj );
        return;
    }
    // go through the branches
    Abc_CollectTopOr_rec( Abc_ObjChild0(pObj), vSuper );
    Abc_CollectTopOr_rec( Abc_ObjChild1(pObj), vSuper );
}